

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O1

bool __thiscall
gss::innards::HomomorphismModel::initialise_domains
          (HomomorphismModel *this,
          vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
          *domains)

{
  vector<int,_std::allocator<int>_> *this_00;
  uint *puVar1;
  BitWord BVar2;
  pointer pvVar3;
  iterator __position;
  pointer piVar4;
  pointer piVar5;
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var6;
  pointer pHVar7;
  Proof *pPVar8;
  Lackey *this_01;
  byte bVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  SVOBitset *pSVar13;
  void *__dest;
  pointer pHVar14;
  undefined1 auVar15 [8];
  int iVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  HomomorphismDomain *d;
  ulong uVar21;
  long lVar22;
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  uint uVar37;
  uint uVar38;
  vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
  *__range2;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  patterns_ndss;
  SVOBitset ni;
  vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  targets_ndss;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  hall_rhs;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  hall_lhs;
  bool wipeout;
  ulong local_1e8;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  local_1e0;
  undefined1 local_1c8 [16];
  undefined1 auStack_1b8 [120];
  vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  local_140;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_128;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  undefined1 local_e8 [8];
  _Alloc_hider _Stack_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_d0 [2];
  undefined1 local_a8 [64];
  uint local_68;
  NamedVertex local_58;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  
  uVar38 = *(uint *)((long)((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                           _M_head_impl)->params + 0x1c);
  if (uVar38 != 1) {
    uVar38 = this->max_graphs;
  }
  uVar21 = (ulong)uVar38;
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::vector(&local_1e0,uVar21,(allocator_type *)local_1c8);
  std::
  vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ::vector(&local_140,uVar21,(allocator_type *)local_1c8);
  bVar11 = degree_and_nds_are_preserved
                     (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                      _M_head_impl)->params);
  if (((bVar11) && (uVar21 != 0)) &&
     (*(char *)((long)((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                      _M_head_impl)->params + 0x8a) == '\0')) {
    lVar22 = 0;
    uVar21 = 0;
    do {
      uVar19 = ((long)local_1e0.
                      super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_1e0.
                      super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      if ((uVar19 < uVar21 || uVar19 - uVar21 == 0) ||
         (std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)((long)&((local_1e0.
                                super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar22),
                   (ulong)this->pattern_size),
         uVar19 = ((long)local_140.
                         super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_140.
                         super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
         uVar19 < uVar21 || uVar19 - uVar21 == 0)) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar21);
      }
      std::
      vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
      ::resize((vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>
                *)((long)local_140.
                         super__Vector_base<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar22),
               (ulong)this->target_size);
      uVar21 = uVar21 + 1;
      lVar22 = lVar22 + 0x18;
    } while (uVar38 != (uint)uVar21);
    local_1e8 = 0;
    do {
      iVar17 = (int)local_1e8;
      if (this->pattern_size != 0) {
        uVar18 = 0;
        do {
          SVOBitset::SVOBitset
                    ((SVOBitset *)local_1c8,
                     (SVOBitset *)
                     ((ulong)(this->max_graphs * uVar18 + iVar17) * 0x88 +
                     *(long *)&(((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                 .
                                 super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                ._M_head_impl)->pattern_graph_rows).
                               super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                     ));
          uVar21 = (ulong)(uint)auStack_1b8._112_4_;
          pSVar13 = (SVOBitset *)local_1c8;
          if (0x10 < uVar21) {
            pSVar13 = (SVOBitset *)local_1c8._0_8_;
          }
          iVar16 = -1;
          if (uVar21 != 0) {
            lVar22 = 0;
LAB_0012b867:
            BVar2 = (pSVar13->_data).short_data[0];
            if (BVar2 == 0) goto code_r0x0012b86f;
            iVar16 = 0;
            for (; (BVar2 & 1) == 0; BVar2 = BVar2 >> 1 | 0x8000000000000000) {
              iVar16 = iVar16 + 1;
            }
            iVar16 = iVar16 - (int)lVar22;
          }
LAB_0012b888:
          uVar21 = (ulong)uVar18;
LAB_0012b88d:
          if (iVar16 != -1) {
            pSVar13 = (SVOBitset *)local_1c8;
            if (0x10 < (uint)auStack_1b8._112_4_) {
              pSVar13 = (SVOBitset *)local_1c8._0_8_;
            }
            bVar9 = (byte)iVar16 & 0x3f;
            iVar23 = iVar16 + 0x3f;
            if (-1 < iVar16) {
              iVar23 = iVar16;
            }
            (pSVar13->_data).short_data[iVar23 >> 6] =
                 (pSVar13->_data).short_data[iVar23 >> 6] &
                 (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
            uVar20 = ((long)local_1e0.
                            super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_1e0.
                            super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
            uVar19 = local_1e8;
            if ((uVar20 < local_1e8 || uVar20 - local_1e8 == 0) ||
               (pvVar3 = local_1e0.
                         super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_1e8].
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
               uVar20 = ((long)local_1e0.
                               super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[local_1e8].
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                        -0x5555555555555555, uVar19 = uVar21,
               uVar20 < uVar21 || uVar20 - uVar21 == 0)) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar19);
            }
            this_00 = pvVar3 + uVar21;
            iVar16 = *(int *)(*(long *)(*(long *)&(((this->_imp)._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl)->patterns_degrees).
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       + (long)iVar17 * 0x18) + (long)iVar16 * 4);
            local_e8._0_4_ = iVar16;
            __position._M_current =
                 (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (this_00,__position,(int *)local_e8);
            }
            else {
              *__position._M_current = iVar16;
              (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            uVar19 = (ulong)(uint)auStack_1b8._112_4_;
            pSVar13 = (SVOBitset *)local_1c8;
            if (0x10 < uVar19) {
              pSVar13 = (SVOBitset *)local_1c8._0_8_;
            }
            iVar16 = -1;
            if (uVar19 != 0) {
              lVar22 = 0;
              while (BVar2 = (pSVar13->_data).short_data[0], BVar2 == 0) {
                lVar22 = lVar22 + -0x40;
                pSVar13 = (SVOBitset *)((long)&pSVar13->_data + 8);
                if (uVar19 * 0x40 + lVar22 == 0) goto LAB_0012b88d;
              }
              iVar16 = 0;
              for (; (BVar2 & 1) == 0; BVar2 = BVar2 >> 1 | 0x8000000000000000) {
                iVar16 = iVar16 + 1;
              }
              iVar16 = iVar16 - (int)lVar22;
            }
            goto LAB_0012b88d;
          }
          uVar20 = ((long)local_1e0.
                          super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_1e0.
                          super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          uVar19 = local_1e8;
          if ((uVar20 < local_1e8 || uVar20 - local_1e8 == 0) ||
             (pvVar3 = local_1e0.
                       super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_1e8].
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             uVar20 = ((long)local_1e0.
                             super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[local_1e8].
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                      -0x5555555555555555, uVar19 = uVar21, uVar20 < uVar21 || uVar20 - uVar21 == 0)
             ) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar19);
          }
          piVar4 = pvVar3[uVar21].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar5 = *(pointer *)
                    ((long)&pvVar3[uVar21].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data + 8);
          if (piVar4 != piVar5) {
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
                      (piVar4,piVar5,(int)LZCOUNT((long)piVar5 - (long)piVar4 >> 2) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
                      (piVar4);
          }
          if ((0x10 < (uint)auStack_1b8._112_4_) &&
             ((SVOBitset *)local_1c8._0_8_ != (SVOBitset *)0x0)) {
            operator_delete__((void *)local_1c8._0_8_);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 < this->pattern_size);
      }
      local_1e8 = (ulong)(iVar17 + 1U);
    } while (iVar17 + 1U != uVar38);
  }
  if (this->pattern_size != 0) {
    uVar18 = 0;
    do {
      uVar19 = (ulong)uVar18;
      pHVar14 = (domains->
                super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar21 = ((long)(domains->
                      super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar14 >> 3) *
               -0x79435e50d79435e5;
      if (uVar21 < uVar19 || uVar21 - uVar19 == 0) {
LAB_0012c50c:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar19);
      }
      pSVar13 = &pHVar14[uVar19].values;
      *(uint *)((long)(pSVar13 + -1) + 0x78) = uVar18;
      if ((ulong)pSVar13->n_words < 0x11) {
        auVar33 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
        *(undefined1 (*) [64])((long)&pSVar13->_data + 0x40) = auVar33;
        auVar33 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
        *(undefined1 (*) [64])&pSVar13->_data = auVar33;
      }
      else {
        memset((pSVar13->_data).long_data,0,(ulong)pSVar13->n_words << 3);
      }
      if (this->target_size != 0) {
        uVar21 = 0;
        do {
          _Var6._M_head_impl =
               (this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
          piVar4 = *(pointer *)
                    &((_Var6._M_head_impl)->pattern_vertex_labels).
                     super__Vector_base<int,_std::allocator<int>_>;
          iVar17 = (int)uVar21;
          if ((((piVar4 == *(pointer *)((long)&(_Var6._M_head_impl)->pattern_vertex_labels + 8)) ||
               (piVar4[(int)uVar18] ==
                *(int *)(*(long *)&((_Var6._M_head_impl)->target_vertex_labels).
                                   super__Vector_base<int,_std::allocator<int>_> + (long)iVar17 * 4)
               )) && (bVar11 = _check_loop_compatibility(this,uVar18,iVar17), bVar11)) &&
             ((bVar11 = _check_degree_compatibility
                                  (this,uVar18,iVar17,uVar38,&local_1e0,&local_140,
                                   *(long *)&(((this->_imp)._M_t.
                                               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                               .
                                               super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                              ._M_head_impl)->proof).
                                             super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                                   != 0), bVar11 &&
              (bVar11 = _check_clique_compatibility(this,uVar18,iVar17), bVar11)))) {
            pHVar14 = (domains->
                      super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar20 = ((long)(domains->
                            super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar14 >> 3) *
                     -0x79435e50d79435e5;
            if (uVar20 < uVar19 || uVar20 - uVar19 == 0) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar19);
            }
            if (pHVar14[uVar19].values.n_words < 0x11) {
              pSVar13 = &pHVar14[uVar19].values;
            }
            else {
              pSVar13 = (SVOBitset *)pHVar14[uVar19].values._data.short_data[0];
            }
            iVar16 = iVar17 + 0x3f;
            if (-1 < iVar17) {
              iVar16 = iVar17;
            }
            (pSVar13->_data).short_data[iVar16 >> 6] =
                 (pSVar13->_data).short_data[iVar16 >> 6] | 1L << (uVar21 & 0x3f);
          }
          uVar21 = (ulong)(iVar17 + 1U);
        } while (iVar17 + 1U < this->target_size);
      }
      pHVar14 = (domains->
                super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar21 = ((long)(domains->
                      super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar14 >> 3) *
               -0x79435e50d79435e5;
      if (uVar21 < uVar19 || uVar21 - uVar19 == 0) goto LAB_0012c50c;
      uVar21 = (ulong)pHVar14[uVar19].values.n_words;
      if (uVar21 < 0x11) {
        pSVar13 = &pHVar14[uVar19].values;
      }
      else {
        pSVar13 = (SVOBitset *)pHVar14[uVar19].values._data.short_data[0];
      }
      if (uVar21 == 0) {
        uVar37 = 0;
      }
      else {
        auVar31 = vpbroadcastq_avx512f();
        uVar20 = 0;
        auVar32 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar33 = ZEXT1664((undefined1  [16])0x0);
        do {
          auVar35 = auVar33;
          auVar33 = vpbroadcastq_avx512f();
          auVar33 = vporq_avx512f(auVar33,auVar32);
          uVar10 = vpcmpuq_avx512f(auVar33,auVar31,2);
          auVar33 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)&pSVar13->_data + uVar20 * 8));
          auVar34._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * auVar33._8_8_;
          auVar34._0_8_ = (ulong)((byte)uVar10 & 1) * auVar33._0_8_;
          auVar34._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * auVar33._16_8_;
          auVar34._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * auVar33._24_8_;
          auVar34._32_8_ = (ulong)((byte)(uVar10 >> 4) & 1) * auVar33._32_8_;
          auVar34._40_8_ = (ulong)((byte)(uVar10 >> 5) & 1) * auVar33._40_8_;
          auVar34._48_8_ = (ulong)((byte)(uVar10 >> 6) & 1) * auVar33._48_8_;
          auVar34._56_8_ = (uVar10 >> 7) * auVar33._56_8_;
          auVar33 = vpopcntq_avx512_vpopcntdq(auVar34);
          auVar27 = vpmovqd_avx512f(auVar33);
          auVar27 = vpaddd_avx2(auVar35._0_32_,auVar27);
          uVar20 = uVar20 + 8;
          auVar33 = ZEXT3264(auVar27);
        } while ((uVar21 + 7 & 0x1fffffff8) != uVar20);
        auVar27 = vmovdqa32_avx512vl(auVar27);
        bVar11 = (bool)((byte)uVar10 & 1);
        auVar24._0_4_ = (uint)bVar11 * auVar27._0_4_ | (uint)!bVar11 * auVar35._0_4_;
        bVar11 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar24._4_4_ = (uint)bVar11 * auVar27._4_4_ | (uint)!bVar11 * auVar35._4_4_;
        bVar11 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar24._8_4_ = (uint)bVar11 * auVar27._8_4_ | (uint)!bVar11 * auVar35._8_4_;
        bVar11 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar24._12_4_ = (uint)bVar11 * auVar27._12_4_ | (uint)!bVar11 * auVar35._12_4_;
        bVar11 = (bool)((byte)(uVar10 >> 4) & 1);
        auVar28._16_4_ = (uint)bVar11 * auVar27._16_4_ | (uint)!bVar11 * auVar35._16_4_;
        auVar28._0_16_ = auVar24;
        bVar11 = (bool)((byte)(uVar10 >> 5) & 1);
        auVar28._20_4_ = (uint)bVar11 * auVar27._20_4_ | (uint)!bVar11 * auVar35._20_4_;
        bVar11 = (bool)((byte)(uVar10 >> 6) & 1);
        auVar28._24_4_ = (uint)bVar11 * auVar27._24_4_ | (uint)!bVar11 * auVar35._24_4_;
        bVar11 = SUB81(uVar10 >> 7,0);
        auVar28._28_4_ = (uint)bVar11 * auVar27._28_4_ | (uint)!bVar11 * auVar35._28_4_;
        auVar24 = vphaddd_avx(auVar28._16_16_,auVar24);
        auVar24 = vphaddd_avx(auVar24,auVar24);
        auVar24 = vphaddd_avx(auVar24,auVar24);
        uVar37 = auVar24._0_4_;
      }
      pHVar14[uVar19].count = uVar37;
      if (uVar37 == 0) {
        pPVar8 = (((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                  _M_head_impl)->proof).
                 super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (pPVar8 == (Proof *)0x0) goto LAB_0012c4b4;
        uVar38 = pHVar14[uVar19].v;
        local_1c8._0_8_ = (SVOBitset *)auStack_1b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"compatibility stage","");
        Proof::initial_domain_is_empty(pPVar8,uVar38,(string *)local_1c8);
        if ((SVOBitset *)local_1c8._0_8_ == (SVOBitset *)auStack_1b8) goto LAB_0012c4b4;
        goto LAB_0012c2d2;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < this->pattern_size);
  }
  _Var6._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
  if (((*(long *)&((_Var6._M_head_impl)->proof).
                  super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> != 0) &&
      (bVar11 = degree_and_nds_are_preserved((_Var6._M_head_impl)->params), bVar11)) &&
     ((*(char *)((long)((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                       _M_head_impl)->params + 0x8a) == '\0' &&
      (bVar11 = this->pattern_size != 0, bVar11)))) {
    uVar21 = 0;
    do {
      if (this->target_size != 0) {
        uVar18 = 0;
        do {
          pHVar14 = (domains->
                    super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar19 = ((long)(domains->
                          super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar14 >> 3) *
                   -0x79435e50d79435e5;
          if (uVar19 < uVar21 || uVar19 - uVar21 == 0) {
LAB_0012c542:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar21);
          }
          if (pHVar14[uVar21].values.n_words < 0x11) {
            pSVar13 = &pHVar14[uVar21].values;
          }
          else {
            pSVar13 = (SVOBitset *)pHVar14[uVar21].values._data.short_data[0];
          }
          uVar37 = uVar18 + 0x3f;
          if (-1 < (int)uVar18) {
            uVar37 = uVar18;
          }
          if ((((pSVar13->_data).short_data[(int)uVar37 >> 6] >> ((ulong)uVar18 & 0x3f) & 1) != 0)
             && (bVar12 = _check_degree_compatibility
                                    (this,(int)uVar21,uVar18,uVar38,&local_1e0,&local_140,false),
                !bVar12)) {
            pHVar14 = (domains->
                      super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar19 = ((long)(domains->
                            super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar14 >> 3) *
                     -0x79435e50d79435e5;
            if (uVar19 < uVar21 || uVar19 - uVar21 == 0) goto LAB_0012c542;
            if (pHVar14[uVar21].values.n_words < 0x11) {
              pSVar13 = &pHVar14[uVar21].values;
            }
            else {
              pSVar13 = (SVOBitset *)pHVar14[uVar21].values._data.short_data[0];
            }
            (pSVar13->_data).short_data[(int)uVar37 >> 6] =
                 (pSVar13->_data).short_data[(int)uVar37 >> 6] & ~(1L << ((ulong)uVar18 & 0x3f));
            puVar1 = &pHVar14[uVar21].count;
            *puVar1 = *puVar1 - 1;
            if (*puVar1 == 0) {
              pPVar8 = (((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                        _M_head_impl)->proof).
                       super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              if (pPVar8 != (Proof *)0x0) {
                uVar38 = pHVar14[uVar21].v;
                local_1c8._0_8_ = (SVOBitset *)auStack_1b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"nds stage","");
                Proof::initial_domain_is_empty(pPVar8,uVar38,(string *)local_1c8);
                if ((SVOBitset *)local_1c8._0_8_ != (SVOBitset *)auStack_1b8) {
                  operator_delete((void *)local_1c8._0_8_,(ulong)(auStack_1b8._0_8_ + 1));
                }
              }
              if (!bVar11) goto LAB_0012bf1c;
              goto LAB_0012c4b4;
            }
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 < this->target_size);
      }
      uVar21 = uVar21 + 1;
      bVar11 = uVar21 < this->pattern_size;
    } while (bVar11);
  }
LAB_0012bf1c:
  bVar11 = is_nonshrinking(((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                           _M_head_impl)->params);
  if (bVar11) {
    SVOBitset::SVOBitset((SVOBitset *)local_1c8,this->target_size,0);
    pHVar14 = (domains->
              super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pHVar7 = (domains->
             super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pHVar14 != pHVar7) {
      do {
        SVOBitset::operator|=((SVOBitset *)local_1c8,&pHVar14->values);
        pHVar14 = pHVar14 + 1;
      } while (pHVar14 != pHVar7);
    }
    uVar21 = (ulong)(uint)auStack_1b8._112_4_;
    pSVar13 = (SVOBitset *)local_1c8;
    if (0x10 < uVar21) {
      pSVar13 = (SVOBitset *)local_1c8._0_8_;
    }
    if (uVar21 == 0) {
      uVar38 = 0;
    }
    else {
      auVar31 = vpbroadcastq_avx512f();
      uVar19 = 0;
      auVar32 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar33 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar34 = auVar33;
        auVar33 = vpbroadcastq_avx512f();
        auVar33 = vporq_avx512f(auVar33,auVar32);
        uVar20 = vpcmpuq_avx512f(auVar33,auVar31,2);
        auVar33 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)&pSVar13->_data + uVar19 * 8));
        auVar35._8_8_ = (ulong)((byte)(uVar20 >> 1) & 1) * auVar33._8_8_;
        auVar35._0_8_ = (ulong)((byte)uVar20 & 1) * auVar33._0_8_;
        auVar35._16_8_ = (ulong)((byte)(uVar20 >> 2) & 1) * auVar33._16_8_;
        auVar35._24_8_ = (ulong)((byte)(uVar20 >> 3) & 1) * auVar33._24_8_;
        auVar35._32_8_ = (ulong)((byte)(uVar20 >> 4) & 1) * auVar33._32_8_;
        auVar35._40_8_ = (ulong)((byte)(uVar20 >> 5) & 1) * auVar33._40_8_;
        auVar35._48_8_ = (ulong)((byte)(uVar20 >> 6) & 1) * auVar33._48_8_;
        auVar35._56_8_ = (uVar20 >> 7) * auVar33._56_8_;
        auVar33 = vpopcntq_avx512_vpopcntdq(auVar35);
        auVar27 = vpmovqd_avx512f(auVar33);
        auVar27 = vpaddd_avx2(auVar34._0_32_,auVar27);
        uVar19 = uVar19 + 8;
        auVar33 = ZEXT3264(auVar27);
      } while ((uVar21 + 7 & 0x1fffffff8) != uVar19);
      auVar27 = vmovdqa32_avx512vl(auVar27);
      bVar11 = (bool)((byte)uVar20 & 1);
      auVar25._0_4_ = (uint)bVar11 * auVar27._0_4_ | (uint)!bVar11 * auVar34._0_4_;
      bVar11 = (bool)((byte)(uVar20 >> 1) & 1);
      auVar25._4_4_ = (uint)bVar11 * auVar27._4_4_ | (uint)!bVar11 * auVar34._4_4_;
      bVar11 = (bool)((byte)(uVar20 >> 2) & 1);
      auVar25._8_4_ = (uint)bVar11 * auVar27._8_4_ | (uint)!bVar11 * auVar34._8_4_;
      bVar11 = (bool)((byte)(uVar20 >> 3) & 1);
      auVar25._12_4_ = (uint)bVar11 * auVar27._12_4_ | (uint)!bVar11 * auVar34._12_4_;
      bVar11 = (bool)((byte)(uVar20 >> 4) & 1);
      auVar29._16_4_ = (uint)bVar11 * auVar27._16_4_ | (uint)!bVar11 * auVar34._16_4_;
      auVar29._0_16_ = auVar25;
      bVar11 = (bool)((byte)(uVar20 >> 5) & 1);
      auVar29._20_4_ = (uint)bVar11 * auVar27._20_4_ | (uint)!bVar11 * auVar34._20_4_;
      bVar11 = (bool)((byte)(uVar20 >> 6) & 1);
      auVar29._24_4_ = (uint)bVar11 * auVar27._24_4_ | (uint)!bVar11 * auVar34._24_4_;
      bVar11 = SUB81(uVar20 >> 7,0);
      auVar29._28_4_ = (uint)bVar11 * auVar27._28_4_ | (uint)!bVar11 * auVar34._28_4_;
      auVar24 = vphaddd_avx(auVar29._16_16_,auVar25);
      auVar24 = vphaddd_avx(auVar24,auVar24);
      auVar24 = vphaddd_avx(auVar24,auVar24);
      uVar38 = auVar24._0_4_;
    }
    if (this->pattern_size <= uVar38) {
      if ((SVOBitset *)local_1c8._0_8_ != (SVOBitset *)0x0 && 0x10 < (uint)auStack_1b8._112_4_) {
        operator_delete__((void *)local_1c8._0_8_);
      }
      goto LAB_0012c124;
    }
    if (*(long *)&(((this->_imp)._M_t.
                    super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                   _M_head_impl)->proof).
                  super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> != 0) {
      local_108.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_128.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_128.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pHVar14 = (domains->
                super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pHVar7 = (domains->
               super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pHVar14 != pHVar7) {
        do {
          pattern_vertex_for_proof_abi_cxx11_((NamedVertex *)local_e8,this,pHVar14->v);
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<std::pair<int,std::__cxx11::string>>
                    ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      *)&local_108,(NamedVertex *)local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Stack_e0._M_p != aaStack_d0) {
            operator_delete(_Stack_e0._M_p,aaStack_d0[0]._M_allocated_capacity + 1);
          }
          pHVar14 = pHVar14 + 1;
        } while (pHVar14 != pHVar7);
      }
      local_68 = auStack_1b8._112_4_;
      if ((ulong)(uint)auStack_1b8._112_4_ < 0x11) {
        auVar33._8_8_ = local_1c8._8_8_;
        auVar33._0_8_ = local_1c8._0_8_;
        auVar33._16_8_ = auStack_1b8._0_8_;
        auVar33._24_8_ = auStack_1b8._8_8_;
        auVar33._32_32_ = auStack_1b8._16_32_;
        auVar33 = vmovdqu64_avx512f(auVar33);
        auVar31 = vmovdqu64_avx512f(auStack_1b8._48_64_);
        local_a8 = vmovdqu64_avx512f(auVar31);
        _local_e8 = vmovdqu64_avx512f(auVar33);
      }
      else {
        uVar21 = (ulong)(uint)auStack_1b8._112_4_ << 3;
        __dest = operator_new__(uVar21);
        local_e8 = (undefined1  [8])__dest;
        memmove(__dest,(void *)local_1c8._0_8_,uVar21);
      }
      uVar38 = local_68;
      uVar21 = (ulong)local_68;
      if (uVar21 < 0x11) {
        auVar15 = (undefined1  [8])local_e8;
      }
      else {
        auVar15 = local_e8;
      }
      iVar17 = -1;
      if (uVar21 != 0) {
        lVar22 = 0;
LAB_0012c343:
        uVar19 = *(ulong *)auVar15;
        if (uVar19 == 0) goto code_r0x0012c34b;
        iVar17 = 0;
        for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
          iVar17 = iVar17 + 1;
        }
        iVar17 = iVar17 - (int)lVar22;
      }
LAB_0012c364:
      if (iVar17 != -1) {
        do {
          auVar15 = (undefined1  [8])local_e8;
          if (0x10 < uVar38) {
            auVar15 = local_e8;
          }
          bVar9 = (byte)iVar17 & 0x3f;
          iVar16 = iVar17 + 0x3f;
          if (-1 < iVar17) {
            iVar16 = iVar17;
          }
          *(ulong *)((long)auVar15 + (long)(iVar16 >> 6) * 8) =
               *(ulong *)((long)auVar15 + (long)(iVar16 >> 6) * 8) &
               (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
          target_vertex_for_proof_abi_cxx11_(&local_58,this,iVar17);
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<std::pair<int,std::__cxx11::string>>
                    ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      *)&local_128,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58.second._M_dataplus._M_p != &local_58.second.field_2) {
            operator_delete(local_58.second._M_dataplus._M_p,
                            local_58.second.field_2._M_allocated_capacity + 1);
          }
          auVar15 = (undefined1  [8])local_e8;
          if (0x10 < uVar38) {
            auVar15 = local_e8;
          }
          iVar17 = -1;
          if (uVar21 != 0) {
            lVar22 = 0;
LAB_0012c418:
            uVar19 = *(ulong *)auVar15;
            if (uVar19 == 0) goto code_r0x0012c420;
            iVar17 = 0;
            for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
              iVar17 = iVar17 + 1;
            }
            iVar17 = iVar17 - (int)lVar22;
          }
LAB_0012c439:
        } while (iVar17 != -1);
      }
      Proof::emit_hall_set_or_violator
                ((((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                   .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                  _M_head_impl)->proof).
                 super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &local_108,&local_128);
      if ((0x10 < uVar38) && (local_e8 != (undefined1  [8])0x0)) {
        operator_delete__((void *)local_e8);
      }
      std::
      vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_128);
      std::
      vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_108);
    }
    if ((0x10 < (uint)auStack_1b8._112_4_) && ((SVOBitset *)local_1c8._0_8_ != (SVOBitset *)0x0)) {
      operator_delete__((void *)local_1c8._0_8_);
    }
LAB_0012c4b4:
    bVar11 = false;
  }
  else {
LAB_0012c124:
    pHVar14 = (domains->
              super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pHVar7 = (domains->
             super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pHVar14 != pHVar7) {
      _Var6._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      auVar33 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        uVar21 = (ulong)(pHVar14->values).n_words;
        if (uVar21 < 0x11) {
          pSVar13 = &pHVar14->values;
        }
        else {
          pSVar13 = (SVOBitset *)(pHVar14->values)._data.short_data[0];
        }
        if (uVar21 == 0) {
          uVar38 = 0;
        }
        else {
          auVar32 = vpbroadcastq_avx512f();
          uVar19 = 0;
          auVar31 = ZEXT1664((undefined1  [16])0x0);
          do {
            auVar34 = auVar31;
            auVar31 = vpbroadcastq_avx512f();
            auVar31 = vporq_avx512f(auVar31,auVar33);
            uVar20 = vpcmpuq_avx512f(auVar31,auVar32,2);
            auVar31 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)&pSVar13->_data + uVar19 * 8));
            auVar36._8_8_ = (ulong)((byte)(uVar20 >> 1) & 1) * auVar31._8_8_;
            auVar36._0_8_ = (ulong)((byte)uVar20 & 1) * auVar31._0_8_;
            auVar36._16_8_ = (ulong)((byte)(uVar20 >> 2) & 1) * auVar31._16_8_;
            auVar36._24_8_ = (ulong)((byte)(uVar20 >> 3) & 1) * auVar31._24_8_;
            auVar36._32_8_ = (ulong)((byte)(uVar20 >> 4) & 1) * auVar31._32_8_;
            auVar36._40_8_ = (ulong)((byte)(uVar20 >> 5) & 1) * auVar31._40_8_;
            auVar36._48_8_ = (ulong)((byte)(uVar20 >> 6) & 1) * auVar31._48_8_;
            auVar36._56_8_ = (uVar20 >> 7) * auVar31._56_8_;
            auVar31 = vpopcntq_avx512_vpopcntdq(auVar36);
            auVar27 = vpmovqd_avx512f(auVar31);
            auVar27 = vpaddd_avx2(auVar34._0_32_,auVar27);
            uVar19 = uVar19 + 8;
            auVar31 = ZEXT3264(auVar27);
          } while ((uVar21 + 7 & 0x1fffffff8) != uVar19);
          auVar27 = vmovdqa32_avx512vl(auVar27);
          bVar11 = (bool)((byte)uVar20 & 1);
          auVar26._0_4_ = (uint)bVar11 * auVar27._0_4_ | (uint)!bVar11 * auVar34._0_4_;
          bVar11 = (bool)((byte)(uVar20 >> 1) & 1);
          auVar26._4_4_ = (uint)bVar11 * auVar27._4_4_ | (uint)!bVar11 * auVar34._4_4_;
          bVar11 = (bool)((byte)(uVar20 >> 2) & 1);
          auVar26._8_4_ = (uint)bVar11 * auVar27._8_4_ | (uint)!bVar11 * auVar34._8_4_;
          bVar11 = (bool)((byte)(uVar20 >> 3) & 1);
          auVar26._12_4_ = (uint)bVar11 * auVar27._12_4_ | (uint)!bVar11 * auVar34._12_4_;
          bVar11 = (bool)((byte)(uVar20 >> 4) & 1);
          auVar30._16_4_ = (uint)bVar11 * auVar27._16_4_ | (uint)!bVar11 * auVar34._16_4_;
          auVar30._0_16_ = auVar26;
          bVar11 = (bool)((byte)(uVar20 >> 5) & 1);
          auVar30._20_4_ = (uint)bVar11 * auVar27._20_4_ | (uint)!bVar11 * auVar34._20_4_;
          bVar11 = (bool)((byte)(uVar20 >> 6) & 1);
          auVar30._24_4_ = (uint)bVar11 * auVar27._24_4_ | (uint)!bVar11 * auVar34._24_4_;
          bVar11 = SUB81(uVar20 >> 7,0);
          auVar30._28_4_ = (uint)bVar11 * auVar27._28_4_ | (uint)!bVar11 * auVar34._28_4_;
          auVar24 = vphaddd_avx(auVar30._16_16_,auVar26);
          auVar24 = vphaddd_avx(auVar24,auVar24);
          auVar24 = vphaddd_avx(auVar24,auVar24);
          uVar38 = auVar24._0_4_;
        }
        pHVar14->count = uVar38;
        if ((uVar38 == 0) &&
           (pPVar8 = ((_Var6._M_head_impl)->proof).
                     super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
           pPVar8 != (Proof *)0x0)) {
          uVar38 = pHVar14->v;
          local_1c8._0_8_ = (SVOBitset *)auStack_1b8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c8,"post-initialisation stage","");
          Proof::initial_domain_is_empty(pPVar8,uVar38,(string *)local_1c8);
          if ((SVOBitset *)local_1c8._0_8_ != (SVOBitset *)auStack_1b8) {
LAB_0012c2d2:
            operator_delete((void *)local_1c8._0_8_,(ulong)(auStack_1b8._0_8_ + 1));
          }
          goto LAB_0012c4b4;
        }
        pHVar14 = pHVar14 + 1;
      } while (pHVar14 != pHVar7);
    }
    this_01 = *(Lackey **)
               ((long)((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                      _M_head_impl)->params + 0xc0);
    if (this_01 != (Lackey *)0x0) {
      local_1c8._8_8_ = local_e8;
      auVar31[0x3f] = 0;
      auVar31._0_63_ = stack0xffffffffffffff19;
      _local_e8 = auVar31 << 8;
      auStack_1b8._8_8_ =
           std::
           _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:697:58)>
           ::_M_invoke;
      auStack_1b8._0_8_ =
           std::
           _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:697:58)>
           ::_M_manager;
      local_1c8._0_8_ = domains;
      bVar11 = Lackey::reduce_initial_bounds(this_01,(RestrictRangeFunction *)local_1c8);
      auVar33 = _local_e8;
      if ((code *)auStack_1b8._0_8_ != (code *)0x0) {
        (*(code *)auStack_1b8._0_8_)(local_1c8,local_1c8,3);
      }
      if (!bVar11 || (auVar33 & (undefined1  [64])0x1) != (undefined1  [64])0x0) goto LAB_0012c4b4;
    }
    bVar11 = true;
  }
  std::
  vector<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::vector<std::optional<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::optional<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ::~vector(&local_140);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector(&local_1e0);
  return bVar11;
code_r0x0012b86f:
  lVar22 = lVar22 + -0x40;
  pSVar13 = (SVOBitset *)((long)&pSVar13->_data + 8);
  if (uVar21 * 0x40 + lVar22 == 0) goto LAB_0012b888;
  goto LAB_0012b867;
code_r0x0012c34b:
  lVar22 = lVar22 + -0x40;
  auVar15 = (undefined1  [8])((long)auVar15 + 8);
  if (uVar21 * 0x40 + lVar22 == 0) goto LAB_0012c364;
  goto LAB_0012c343;
code_r0x0012c420:
  lVar22 = lVar22 + -0x40;
  auVar15 = (undefined1  [8])((long)auVar15 + 8);
  if (uVar21 * 0x40 + lVar22 == 0) goto LAB_0012c439;
  goto LAB_0012c418;
}

Assistant:

auto HomomorphismModel::initialise_domains(vector<HomomorphismDomain> & domains) const -> bool
{
    unsigned max_graphs_for_degree_things = (_imp->params.injectivity == Injectivity::LocallyInjective ? 1 : max_graphs);

    /* pattern and target neighbourhood degree sequences */
    vector<vector<vector<int>>> patterns_ndss(max_graphs_for_degree_things);
    vector<vector<optional<vector<int>>>> targets_ndss(max_graphs_for_degree_things);

    if (degree_and_nds_are_preserved(_imp->params) && ! _imp->params.no_nds) {
        for (unsigned g = 0; g < max_graphs_for_degree_things; ++g) {
            patterns_ndss.at(g).resize(pattern_size);
            targets_ndss.at(g).resize(target_size);
        }

        for (unsigned g = 0; g < max_graphs_for_degree_things; ++g) {
            for (unsigned i = 0; i < pattern_size; ++i) {
                auto ni = pattern_graph_row(g, i);
                for (auto j = ni.find_first(); j != decltype(ni)::npos; j = ni.find_first()) {
                    ni.reset(j);
                    patterns_ndss.at(g).at(i).push_back(pattern_degree(g, j));
                }
                sort(patterns_ndss.at(g).at(i).begin(), patterns_ndss.at(g).at(i).end(), greater<int>());
            }
        }
    }

    for (unsigned i = 0; i < pattern_size; ++i) {
        domains.at(i).v = i;
        domains.at(i).values.reset();

        for (unsigned j = 0; j < target_size; ++j) {
            bool ok = true;

            if (! _check_label_compatibility(i, j))
                ok = false;
            else if (! _check_loop_compatibility(i, j))
                ok = false;
            else if (! _check_degree_compatibility(i, j, max_graphs_for_degree_things, patterns_ndss, targets_ndss, _imp->proof.get()))
                ok = false;
            else if (! _check_clique_compatibility(i, j))
                ok = false;

            if (ok)
                domains.at(i).values.set(j);
        }

        domains.at(i).count = domains.at(i).values.count();
        if (0 == domains.at(i).count) {
            if (_imp->proof)
                _imp->proof->initial_domain_is_empty(domains.at(i).v, "compatibility stage");
            return false;
        }
    }

    // for proof logging, we need degree information before we can output nds proofs
    if (_imp->proof && degree_and_nds_are_preserved(_imp->params) && ! _imp->params.no_nds) {
        for (unsigned i = 0; i < pattern_size; ++i) {
            for (unsigned j = 0; j < target_size; ++j) {
                if (domains.at(i).values.test(j) &&
                    ! _check_degree_compatibility(i, j, max_graphs_for_degree_things, patterns_ndss, targets_ndss, false)) {
                    domains.at(i).values.reset(j);
                    if (0 == --domains.at(i).count) {
                        if (_imp->proof)
                            _imp->proof->initial_domain_is_empty(domains.at(i).v, "nds stage");
                        return false;
                    }
                }
            }
        }
    }

    // quick sanity check that we have enough values
    if (is_nonshrinking(_imp->params)) {
        SVOBitset domains_union{target_size, 0};
        for (auto & d : domains)
            domains_union |= d.values;

        unsigned domains_union_popcount = domains_union.count();
        if (domains_union_popcount < unsigned(pattern_size)) {
            if (_imp->proof) {
                vector<NamedVertex> hall_lhs, hall_rhs;
                for (auto & d : domains)
                    hall_lhs.push_back(pattern_vertex_for_proof(d.v));
                auto dd = domains_union;
                for (auto v = dd.find_first(); v != decltype(dd)::npos; v = dd.find_first()) {
                    dd.reset(v);
                    hall_rhs.push_back(target_vertex_for_proof(v));
                }
                _imp->proof->emit_hall_set_or_violator(hall_lhs, hall_rhs);
            }
            return false;
        }
    }

    for (auto & d : domains) {
        d.count = d.values.count();
        if (0 == d.count && _imp->proof) {
            _imp->proof->initial_domain_is_empty(d.v, "post-initialisation stage");
            return false;
        }
    }

    if (_imp->params.lackey) {
        // If we're dealing with a model from Essence, it's possible some values will
        // be completely eliminated from the upper and lower bounds of certain domains,
        // in which case they won't show up as being deleted during propagation.
        bool wipeout = false;
        if (! _imp->params.lackey->reduce_initial_bounds([&](int p, int t) -> void {
                for (auto & d : domains)
                    if (d.v == unsigned(p)) {
                        if (d.values.test(t)) {
                            d.values.reset(t);
                            if (0 == --d.count)
                                wipeout = true;
                        }
                        break;
                    }
            }) ||
            wipeout) {
            return false;
        }
    }

    return true;
}